

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_group_t bsc_group_create_neighbourhood(bsc_pid_t *neighbours,bsc_size_t size)

{
  int local_44;
  group_t *pgStack_40;
  bsc_size_t offset;
  group_t *g;
  bsc_size_t *outgoing;
  bsc_size_t *incoming;
  uint local_20;
  bsc_pid_t n_members;
  bsc_pid_t s;
  bsc_pid_t P;
  bsc_pid_t i;
  bsc_size_t size_local;
  bsc_pid_t *neighbours_local;
  
  P = size;
  _i = neighbours;
  n_members = bsp_nprocs();
  local_20 = bsp_pid();
  incoming._4_4_ = 0;
  outgoing = (bsc_size_t *)calloc((long)n_members,4);
  g = (group_t *)calloc((long)n_members,4);
  pgStack_40 = (group_t *)calloc(1,0x20);
  if (((outgoing == (bsc_size_t *)0x0) || (g == (group_t *)0x0)) || (pgStack_40 == (group_t *)0x0))
  {
    bsp_abort("bsc_group_create_neighbourhood: Insufficient memory");
  }
  bsp_push_reg(outgoing,n_members << 2);
  bsp_sync();
  for (s = 0; s < P; s = s + 1) {
    local_44 = s + 1;
    bsp_put(_i[s],&local_44,outgoing,local_20 << 2,4);
    (&g->size)[_i[s]] = s + 1;
  }
  bsp_sync();
  if ((&g->size)[(int)local_20] == 0) {
    bsp_abort("bsc_group_create_neighbourhood: Group must include calling process");
  }
  for (s = 0; s < n_members; s = s + 1) {
    if ((outgoing[s] == 0) || ((&g->size)[s] != 0)) {
      if ((outgoing[s] == 0) && ((&g->size)[s] != 0)) {
        bsp_abort("bsc_group_create_neighourhood: Processes %d thinks %d is a neighbour, but that feeling is not mutual\n"
                  ,(ulong)local_20,(ulong)(uint)s);
      }
      else if ((outgoing[s] != 0) && ((&g->size)[s] != 0)) {
        incoming._4_4_ = incoming._4_4_ + 1;
      }
    }
    else {
      bsp_abort("bsc_group_create_neighourhood: Processes %d thinks %d is a neighbour, but that feeling is not mutual\n"
                ,(ulong)(uint)s,(ulong)local_20);
    }
  }
  group_create(pgStack_40,incoming._4_4_);
  for (s = 0; s < n_members; s = s + 1) {
    pgStack_40->lid[s] = -1;
  }
  for (s = 0; s < P; s = s + 1) {
    pgStack_40->lid[_i[s]] = s;
    pgStack_40->rof[s] = outgoing[_i[s]] + -1;
    pgStack_40->gid[s] = _i[s];
  }
  bsp_pop_reg(outgoing);
  bsp_sync();
  free(outgoing);
  free(g);
  return pgStack_40;
}

Assistant:

bsc_group_t bsc_group_create_neighbourhood( bsc_pid_t * neighbours, 
        bsc_size_t size )
{
    bsc_pid_t i, P = bsp_nprocs(), s = bsp_pid();
    bsc_pid_t n_members = 0;
    bsc_size_t * incoming = calloc( P, sizeof(incoming[0]));
    bsc_size_t * outgoing = calloc( P, sizeof(outgoing[0]));
    group_t * g = calloc( 1, sizeof(*g) );
    if (!incoming || !outgoing || !g)
        bsp_abort("bsc_group_create_neighbourhood: Insufficient memory");
    bsp_push_reg( incoming, P*sizeof(incoming[0]) );
    bsp_sync();

    /* fill the communication matrix with a 1 for each connection */
    for ( i = 0 ; i < size ; ++i ) {
        bsc_size_t offset = i+1;
        bsp_put( neighbours[i], &offset, incoming, s*sizeof(offset), sizeof(offset) );
        outgoing[ neighbours[i] ] = i+1 ;
    }
    bsp_sync();

    if ( !outgoing[s] )
        bsp_abort("bsc_group_create_neighbourhood: Group must include calling process");

    /* take the intersection of incoming and outgoing */
    for ( i = 0; i < P; ++i ) {
        if (incoming[i] && !outgoing[i])  {
            bsp_abort("bsc_group_create_neighourhood: Processes %d thinks %d"
                    " is a neighbour, but that feeling is not mutual\n",
                    i, s );
        }
        else if (!incoming[i] && outgoing[i]) {
            bsp_abort("bsc_group_create_neighourhood: Processes %d thinks %d"
                    " is a neighbour, but that feeling is not mutual\n",
                    s, i );
        }
        else if (incoming[i] && outgoing[i])
            n_members += 1;
    }

    group_create( g, n_members );
    for ( i = 0; i < P; ++i )
        g->lid[i] = -1;

    for ( i = 0; i < size; ++i ) {
        g->lid[ neighbours[i] ] = i;
        g->rof[ i ] = incoming[ neighbours[i] ] - 1;
        g->gid[ i ] = neighbours[i];
    }

    bsp_pop_reg(incoming);
    bsp_sync();
    free(incoming);
    free(outgoing);

    return g;
}